

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenu::wheelEvent(QMenu *this,QWheelEvent *e)

{
  QMenuPrivate *this_00;
  QWidgetData *pQVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined8 local_38;
  QPoint local_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  if (this_00->scroll != (QMenuScroller *)0x0) {
    pQVar1 = (this->super_QWidget).data;
    local_28 = CONCAT44((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i,
                        (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i);
    local_30.xp.m_i = 0;
    local_30.yp.m_i = 0;
    auVar7 = QEventPoint::position();
    dVar6 = (double)((ulong)auVar7._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._0_8_;
    bVar2 = 2147483647.0 < dVar6;
    if (dVar6 <= -2147483648.0) {
      dVar6 = -2147483648.0;
    }
    dVar5 = (double)((ulong)auVar7._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._8_8_;
    bVar3 = 2147483647.0 < dVar5;
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    local_38 = CONCAT44((int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 |
                                     ~-(ulong)bVar3 & (ulong)dVar5),
                        (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 |
                                     ~-(ulong)bVar2 & (ulong)dVar6));
    cVar4 = QRect::contains(&local_30,SUB81(&local_38,0));
    if (cVar4 != '\0') {
      QMenuPrivate::scrollMenu(this_00,(*(int *)(e + 0x5c) < 1) + ScrollUp,false,false);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::wheelEvent(QWheelEvent *e)
{
    Q_D(QMenu);
    if (d->scroll && rect().contains(e->position().toPoint()))
        d->scrollMenu(e->angleDelta().y() > 0 ?
                      QMenuPrivate::QMenuScroller::ScrollUp : QMenuPrivate::QMenuScroller::ScrollDown);
}